

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O0

int jpeg_read_header(j_decompress_ptr cinfo,boolean require_image)

{
  int local_18;
  int retcode;
  boolean require_image_local;
  j_decompress_ptr cinfo_local;
  
  if ((cinfo->global_state != 200) && (cinfo->global_state != 0xc9)) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  local_18 = jpeg_consume_input(cinfo);
  if (local_18 != 0) {
    if (local_18 == 1) {
      local_18 = 1;
    }
    else if (local_18 == 2) {
      if (require_image != 0) {
        cinfo->err->msg_code = 0x35;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      jpeg_abort((j_common_ptr)cinfo);
      local_18 = 2;
    }
  }
  return local_18;
}

Assistant:

GLOBAL(int)
jpeg_read_header (j_decompress_ptr cinfo, boolean require_image)
{
  int retcode;

  if (cinfo->global_state != DSTATE_START &&
      cinfo->global_state != DSTATE_INHEADER)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  retcode = jpeg_consume_input(cinfo);

  switch (retcode) {
  case JPEG_REACHED_SOS:
    retcode = JPEG_HEADER_OK;
    break;
  case JPEG_REACHED_EOI:
    if (require_image)		/* Complain if application wanted an image */
      ERREXIT(cinfo, JERR_NO_IMAGE);
    /* Reset to start state; it would be safer to require the application to
     * call jpeg_abort, but we can't change it now for compatibility reasons.
     * A side effect is to free any temporary memory (there shouldn't be any).
     */
    jpeg_abort((j_common_ptr) cinfo); /* sets state = DSTATE_START */
    retcode = JPEG_HEADER_TABLES_ONLY;
    break;
  case JPEG_SUSPENDED:
    /* no work */
    break;
  }

  return retcode;
}